

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.cpp
# Opt level: O0

void __thiscall
vkt::texture::util::TextureRenderer::renderQuad
          (TextureRenderer *this,Surface *result,int texUnit,float *texCoord,ReferenceParams *params
          )

{
  float local_78 [2];
  float positions [16];
  float maxAnisotropy;
  ReferenceParams *params_local;
  float *texCoord_local;
  int texUnit_local;
  Surface *result_local;
  TextureRenderer *this_local;
  
  positions[0xf] = 1.0;
  memcpy(local_78,&DAT_01387700,0x40);
  renderQuad(this,result,local_78,texUnit,texCoord,params,1.0);
  return;
}

Assistant:

void TextureRenderer::renderQuad (tcu::Surface& result, int texUnit, const float* texCoord, const ReferenceParams& params)
{
	const float	maxAnisotropy = 1.0f;
	float		positions[]	=
	{
		-1.0,	-1.0f,	0.0f,	1.0f,
		-1.0f,	+1.0f,	0.0f,	1.0f,
		+1.0f,	-1.0f,	0.0f,	1.0f,
		+1.0f,	+1.0f,	0.0f,	1.0f
	};
	renderQuad(result, positions, texUnit, texCoord, params, maxAnisotropy);
}